

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_extensions.cpp
# Opt level: O2

bool __thiscall
ONX_ModelTest::DumpReadWriteReadModel(ONX_ModelTest *this,wchar_t *text_file_full_path)

{
  bool bVar1;
  uint uVar2;
  FILE *pFile;
  shared_ptr<ONX_Model> model;
  ON_TextLog text_log;
  undefined1 local_a8 [136];
  
  if (((text_file_full_path != (wchar_t *)0x0) && (*text_file_full_path != L'\0')) &&
     (pFile = ON_FileStream::Open(text_file_full_path,L"w"), pFile != (FILE *)0x0)) {
    ReadWriteReadModel((ONX_ModelTest *)local_a8);
    if ((local_a8._0_8_ == 0) ||
       (uVar2 = ON_ComponentManifest::ActiveComponentCount
                          ((ON_ComponentManifest *)(local_a8._0_8_ + 0x8d0),Unset), uVar2 == 0)) {
      bVar1 = false;
    }
    else {
      ON_TextLog::ON_TextLog((ON_TextLog *)(local_a8 + 0x10),pFile);
      bVar1 = DumpReadWriteReadModel(this,(ON_TextLog *)(local_a8 + 0x10));
      ON_TextLog::~ON_TextLog((ON_TextLog *)(local_a8 + 0x10));
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_a8 + 8));
    ON_FileStream::Close(pFile);
    return bVar1;
  }
  return false;
}

Assistant:

bool ONX_ModelTest::DumpReadWriteReadModel(const wchar_t* text_file_full_path) const
{
  bool rc = false;
  FILE* fp = nullptr;
  for (;;)
  {
    if (nullptr == text_file_full_path || 0 == text_file_full_path[0])
      break;
    fp = ON_FileStream::Open(text_file_full_path, L"w");
    if (nullptr == fp)
      break;
    const auto model = ReadWriteReadModel();
    if (nullptr == model)
      break;
    if (model->Manifest().ActiveComponentCount(ON_ModelComponent::Type::Unset) <= 0)
      break;
    ON_TextLog text_log(fp);
    rc = DumpReadWriteReadModel(text_log);
    break;
  }

  if (nullptr != fp)
    ON_FileStream::Close(fp);

  return rc;
}